

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O0

void __thiscall Args::Command::addArg(Command *this,ArgPtr *arg)

{
  bool bVar1;
  int iVar2;
  pointer pAVar3;
  undefined8 uVar4;
  CmdLine *pCVar5;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_RSI;
  ArgIface *in_RDI;
  pointer in_stack_ffffffffffffff68;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_stack_ffffffffffffff70;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff78;
  allocator *what;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  __first;
  allocator local_31;
  string local_30 [48];
  
  __first._M_current = in_RSI._M_current;
  pAVar3 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                     ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                      0x14e8ab);
  iVar2 = (*pAVar3->_vptr_ArgIface[2])();
  if ((iVar2 == 0) && (*(int *)((long)&in_RDI[4].m_cmdLine + 4) != 0)) {
    uVar4 = __cxa_allocate_exception(0x30);
    what = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"Addition of commands to command with value is disallowed.",what);
    BaseException::BaseException((BaseException *)in_RSI._M_current,(String *)what);
    __cxa_throw(uVar4,&BaseException::typeinfo,BaseException::~BaseException);
  }
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cbegin((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
            *)in_stack_ffffffffffffff68);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cend((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
          *)in_stack_ffffffffffffff68);
  std::
  find<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>
            (__first,in_RSI,in_stack_ffffffffffffff78);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cend((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
          *)in_stack_ffffffffffffff68);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                      *)in_stack_ffffffffffffff70,
                     (__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                      *)in_stack_ffffffffffffff68);
  if (bVar1) {
    pCVar5 = ArgIface::cmdLine(in_RDI);
    if (pCVar5 != (CmdLine *)0x0) {
      in_stack_ffffffffffffff68 =
           std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                     ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                      0x14ea05);
      pCVar5 = ArgIface::cmdLine(in_RDI);
      (*in_stack_ffffffffffffff68->_vptr_ArgIface[0x12])(in_stack_ffffffffffffff68,pCVar5);
    }
    std::
    vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
    ::push_back(in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void addArg( ArgPtr arg ) override
	{
		if( arg->type() == ArgType::Command && m_opt != ValueOptions::NoValue )
			throw BaseException( String( SL( "Addition of commands to command with "
				"value is disallowed." ) ) );

		if( std::find( m_children.cbegin(), m_children.cend(), arg ) ==
			m_children.cend() )
		{
			if( cmdLine() )
				arg->setCmdLine( cmdLine() );

			m_children.push_back( std::move( arg ) );
		}
	}